

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::Print
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,ostream *out)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  
  poVar1 = std::operator<<(out,
                           "virtual void TPZCompElHDiv<pzshape::TPZShapePrism>::Print(std::ostream &) const [TSHAPE = pzshape::TPZShapePrism]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  TPZInterpolatedElement::Print((TPZInterpolatedElement *)this,out);
  poVar1 = std::operator<<(out,"Side orientation ");
  poVar1 = ::operator<<(poVar1,&(this->fSideOrient).super_TPZVec<int>);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((this->fRestraints).
      super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl._M_node.
      _M_size != 0) {
    std::operator<<(out,"One shape restraints associated with the element\n");
    p_Var2 = (_List_node_base *)&this->fRestraints;
    while (p_Var2 = (((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                     &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&this->fRestraints) {
      TPZOneShapeRestraint::Print((TPZOneShapeRestraint *)(p_Var2 + 1),out);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Print(std::ostream &out) const
{
    out << __PRETTY_FUNCTION__ << std::endl;
    TPZIntelGen<TSHAPE>::Print(out);
    out << "Side orientation " << fSideOrient << std::endl;
    if (fRestraints.size()) {
        out << "One shape restraints associated with the element\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++)
        {
            it->Print(out);
        }
    }



}